

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O1

any * __thiscall iutest::any::operator=(any *this,int *rhs)

{
  placeholder *ppVar1;
  placeholder *__tmp;
  placeholder *ppVar2;
  
  ppVar2 = (placeholder *)operator_new(0x10);
  ppVar2->_vptr_placeholder = (_func_int **)&PTR__placeholder_00237f68;
  *(int *)&ppVar2[1]._vptr_placeholder = *rhs;
  ppVar1 = this->content;
  this->content = ppVar2;
  if (ppVar1 != (placeholder *)0x0) {
    (*ppVar1->_vptr_placeholder[1])();
  }
  return this;
}

Assistant:

any& operator = (const   T& rhs) { any(rhs).swap(*this); return *this; }